

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

Qiniu_Error
Qiniu_Io_PutStream(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,void *ctx,
                  size_t fsize,rdFunc rdr,Qiniu_Io_PutExtra *extra)

{
  Qiniu_Json **ret_00;
  Qiniu_Io_PutExtra *extra_00;
  Qiniu_Io_PutRet *pQVar1;
  Qiniu_Bool QVar2;
  uint code;
  Qiniu_Retry_Decision QVar3;
  CURL *curl;
  char *pcVar4;
  char *extraout_RDX;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  Qiniu_Error QVar9;
  size_t local_90;
  undefined8 local_88;
  curl_httppost *local_80;
  char *bucketName;
  char *accessKey;
  char **upHosts;
  Qiniu_Io_PutRet *local_60;
  Qiniu_Buffer *local_58;
  Qiniu_Buffer *local_50;
  char *defaultUpHosts [1];
  Qiniu_Io_form form;
  
  accessKey = (char *)0x0;
  bucketName = (char *)0x0;
  QVar2 = Qiniu_Utils_Extract_Bucket(uptoken,&accessKey,&bucketName);
  if (QVar2 == 0) {
    pcVar7 = "parse uptoken failed";
    uVar5 = 400;
  }
  else {
    local_60 = ret;
    Qiniu_Io_form_init(&form,uptoken,key,&extra);
    curl_formadd(&form,&form.lastptr,1,"file",0x10,"filename",0x13,ctx,6,fsize,0x11);
    pcVar4 = accessKey;
    pcVar7 = bucketName;
    extra_00 = extra;
    local_80 = form.formpost;
    defaultUpHosts[0] = QINIU_UP_HOST;
    local_88 = curl_slist_append(0,"Expect:");
    QVar9 = _Qiniu_Get_UpHosts(self,pcVar4,pcVar7,extra_00,&upHosts,&local_90);
    if (QVar9.code == 200) {
      if (local_90 == 0) {
        upHosts = defaultUpHosts;
        local_90 = 1;
      }
      local_50 = &self->b;
      ret_00 = &self->root;
      local_58 = &self->respHeader;
      uVar6 = 0;
      while( true ) {
        curl = Qiniu_Client_reset(self);
        QVar9 = Qiniu_Client_config(self);
        if (QVar9.code != 200) goto LAB_00112678;
        curl_easy_setopt(curl,0x2712,upHosts[uVar6 % local_90]);
        curl_easy_setopt(curl,0x2728,local_80);
        curl_easy_setopt(curl,0x2727,local_88);
        curl_easy_setopt(curl,0x4e2c,rdr);
        bVar8 = extra_00->uploadingProgress == (_func_void_size_t_size_t *)0x0;
        if (!bVar8) {
          curl_easy_setopt(curl,0x4e58,_Qiniu_Progress_Callback);
          curl_easy_setopt(curl,0x2749,extra_00->uploadingProgress);
        }
        curl_easy_setopt(curl,0x2b,bVar8);
        QVar9 = Qiniu_callex(curl,local_50,ret_00,0,local_58);
        pQVar1 = local_60;
        pcVar7 = QVar9.message;
        code = QVar9.code;
        if (code == 200) break;
        uVar5 = (ulong)code;
        QVar3 = _Qiniu_Should_Retry(code);
        if ((QVar3 == QINIU_DONT_RETRY) || (uVar6 = uVar6 + 1, self->hostsRetriesMax < uVar6))
        goto LAB_001126ee;
      }
      if (extra_00->callbackRetParser == (_func_Qiniu_Error_void_ptr_Qiniu_Json_ptr *)0x0) {
        uVar5 = 200;
        if (local_60 != (Qiniu_Io_PutRet *)0x0) {
          pcVar4 = Qiniu_Json_GetString(*ret_00,"hash",(char *)0x0);
          pQVar1->hash = pcVar4;
          pcVar4 = Qiniu_Json_GetString(*ret_00,"key",(char *)0x0);
          pQVar1->key = pcVar4;
        }
      }
      else {
        QVar9 = (*extra_00->callbackRetParser)(extra_00->callbackRet,*ret_00);
        uVar5 = (ulong)(uint)QVar9;
        pcVar7 = extraout_RDX;
      }
LAB_001126ee:
      curl_formfree(local_80);
      curl_slist_free_all(local_88);
    }
    else {
LAB_00112678:
      pcVar7 = QVar9.message;
      uVar5 = (ulong)(uint)QVar9.code;
    }
    Qiniu_Free(accessKey);
    Qiniu_Free(bucketName);
  }
  QVar9.message = pcVar7;
  QVar9._0_8_ = uVar5;
  return QVar9;
}

Assistant:

Qiniu_Error Qiniu_Io_PutStream(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key,
    void *ctx, size_t fsize, rdFunc rdr,
    Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    const char *accessKey = NULL, *bucketName = NULL;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form form;
    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    if (key == NULL)
    {
        // Use an empty string instead of the NULL pointer to prevent the curl lib from crashing
        // when read it.
        // **NOTICE**: The magic variable $(filename) will be set as empty string.
        key = "";
    }

    // Add 'filename' property to make it like a file upload one
    // Otherwise it may report: CURL_ERROR(18) or "multipart/message too large"
    // See https://curl.haxx.se/libcurl/c/curl_formadd.html#CURLFORMSTREAM
    // FIXED by fengyh 2017-03-22 10:30
    curl_formadd(
        &form.formpost, &form.lastptr,
        CURLFORM_COPYNAME, "file",
        CURLFORM_FILENAME, "filename",
        CURLFORM_STREAM, ctx,
        CURLFORM_CONTENTSLENGTH, fsize,
        CURLFORM_END);

    err = Qiniu_Io_call_with_callback(self, accessKey, bucketName, ret, form.formpost, rdr, extra);
error:
    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}